

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderSetM44fAttribute(ImfHeader *hdr,char *name,float (*m) [4])

{
  undefined1 uVar1;
  iterator this;
  TypedAttribute<Imath_3_2::Matrix44<float>_> *this_00;
  Matrix44<float> *this_01;
  float (*in_RDX) [4];
  ImfHeader *in_RDI;
  exception *e;
  M44f m4;
  Attribute *in_stack_000004b0;
  char *in_stack_000004b8;
  Header *in_stack_000004c0;
  Header *in_stack_fffffffffffffec8;
  TypedAttribute<Imath_3_2::Matrix44<float>_> *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffffd0;
  Header *in_stack_ffffffffffffffd8;
  
  Imath_3_2::Matrix44<float>::Matrix44((Matrix44<float> *)&stack0xffffffffffffffa0,in_RDX);
  anon_unknown.dwarf_70604::header(in_RDI);
  Imf_3_4::Header::find(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_fffffffffffffed0,(Iterator *)in_stack_fffffffffffffec8);
  anon_unknown.dwarf_70604::header(in_RDI);
  this._M_node = (_Base_ptr)Imf_3_4::Header::end(in_stack_fffffffffffffec8);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_fffffffffffffed0,(Iterator *)in_stack_fffffffffffffec8);
  uVar1 = Imf_3_4::operator==((ConstIterator *)in_stack_fffffffffffffed0,
                              (ConstIterator *)in_stack_fffffffffffffec8);
  if ((bool)uVar1) {
    anon_unknown.dwarf_70604::header(in_RDI);
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>_>::TypedAttribute
              (in_stack_fffffffffffffed0,(Matrix44<float> *)in_stack_fffffffffffffec8);
    Imf_3_4::Header::insert(in_stack_000004c0,in_stack_000004b8,in_stack_000004b0);
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>_>::~TypedAttribute
              ((TypedAttribute<Imath_3_2::Matrix44<float>_> *)0x19da3b);
  }
  else {
    anon_unknown.dwarf_70604::header(in_RDI);
    this_00 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>>
                        ((Header *)this._M_node,(char *)CONCAT17(uVar1,in_stack_fffffffffffffef8));
    this_01 = Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>_>::value(this_00);
    Imath_3_2::Matrix44<float>::operator=(this_01,(Matrix44<float> *)&stack0xffffffffffffffa0);
  }
  return 1;
}

Assistant:

int
ImfHeaderSetM44fAttribute (
    ImfHeader* hdr, const char name[], const float m[4][4])
{
    try
    {
        M44f m4 (m);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::M44fAttribute (m4));
        else
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::M44fAttribute> (name)
                .value () = m4;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}